

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void stmt(Vm *vm)

{
  _Bool _Var1;
  Vm *vm_local;
  
  switch((vm->compiler).token.type) {
  case TOKEN_WHILE:
    (vm->compiler).print_expr = false;
    while_stmt(vm);
    break;
  case TOKEN_FOR:
    (vm->compiler).print_expr = false;
    for_stmt(vm);
    break;
  default:
    simple_stmt(vm);
    break;
  case TOKEN_RETURN:
    if (vm->frame_count < 2) {
      error(&vm->compiler,"Cannot return from global scope");
    }
    (vm->compiler).print_expr = false;
    advance(vm);
    _Var1 = check(vm,TOKEN_SEMICOLON);
    if (_Var1) {
      advance(vm);
      emit_no_arg(vm,OP_NIL);
    }
    else {
      expr(vm);
      consume_optional(vm,TOKEN_SEMICOLON);
    }
    emit_no_arg(vm,OP_RETURN);
    break;
  case TOKEN_EOF:
    (vm->compiler).print_expr = false;
  }
  return;
}

Assistant:

static void stmt(Vm *vm) {
    switch (vm->compiler.token.type) {
        case TOKEN_WHILE:
            vm->compiler.print_expr = false;
            while_stmt(vm);
            break;
        case TOKEN_FOR:
            vm->compiler.print_expr = false;
            for_stmt(vm);
            break;
        case TOKEN_RETURN:
            if (vm->frame_count <= 1) {
                error(&vm->compiler, "Cannot return from global scope");
            }

            vm->compiler.print_expr = false;
            advance(vm);

            if (!check(vm, TOKEN_SEMICOLON)) {
                expr(vm);
                consume_optional(vm, TOKEN_SEMICOLON);
            } else {
                advance(vm);
                emit_no_arg(vm, OP_NIL);
            }

            emit_no_arg(vm, OP_RETURN);
            break;
        case TOKEN_EOF:
            vm->compiler.print_expr = false;
            break;
        default:
            simple_stmt(vm);
            break;
    }
}